

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsignalmapper.cpp
# Opt level: O2

void QSignalMapper::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QSignalMapper::*)(int)>
                      ((QtMocHelpers *)_a,(void **)mappedInt,0,0);
    if ((!bVar1) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QSignalMapper::*)(QString_const&)>
                          ((QtMocHelpers *)_a,(void **)mappedString,0,1), !bVar1)) {
      QtMocHelpers::indexOfMethod<void(QSignalMapper::*)(QObject*)>
                ((QtMocHelpers *)_a,(void **)mappedObject,0,2);
      return;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      mappedInt((QSignalMapper *)_o,*_a[1]);
      return;
    case 1:
      mappedString((QSignalMapper *)_o,(QString *)_a[1]);
      return;
    case 2:
      mappedObject((QSignalMapper *)_o,*_a[1]);
      return;
    case 3:
      map((QSignalMapper *)_o);
      return;
    case 4:
      map((QSignalMapper *)_o,*_a[1]);
      return;
    }
  }
  return;
}

Assistant:

void QSignalMapper::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSignalMapper *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->mappedInt((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->mappedString((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->mappedObject((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        case 3: _t->map(); break;
        case 4: _t->map((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSignalMapper::*)(int )>(_a, &QSignalMapper::mappedInt, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSignalMapper::*)(const QString & )>(_a, &QSignalMapper::mappedString, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSignalMapper::*)(QObject * )>(_a, &QSignalMapper::mappedObject, 2))
            return;
    }
}